

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1ha.c
# Opt level: O2

uint64_t t1ha_64be(void *data,size_t len,uint64_t seed)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  uint uVar15;
  ulong *puVar16;
  ulong uVar17;
  ulong uVar18;
  
  uVar9 = len;
  if (0x20 < len) {
    uVar10 = (len << 0x2f | len >> 0x11) + seed;
    uVar9 = (seed << 0x2f | seed >> 0x11) ^ len;
    puVar16 = (ulong *)((long)data + (len - 0x1f));
    sVar14 = len;
    do {
      uVar1 = *data;
      uVar12 = *(ulong *)((long)data + 8);
      uVar2 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
              | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18
      ;
      uVar11 = uVar2 | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      uVar3 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
              (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8;
      uVar17 = uVar3 | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
               (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38;
      uVar1 = *(ulong *)((long)data + 0x10);
      uVar18 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
               | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 |
               (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      uVar1 = *(ulong *)((long)data + 0x18);
      uVar12 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
               | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 |
               (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      uVar1 = uVar18 + uVar9;
      uVar13 = uVar12 + uVar10;
      uVar10 = ((uVar2 << 0x17 | uVar11 >> 0x29) ^ seed) + uVar10;
      uVar9 = uVar9 - ((uVar3 << 0x21 | uVar17 >> 0x1f) ^ sVar14);
      seed = (((uVar1 << 0x2f | uVar1 >> 0x11) ^ uVar11) + uVar12) * -0x7dbcb016f12310c7 ^ seed;
      sVar14 = (((uVar13 << 0x2f | uVar13 >> 0x11) ^ uVar17) + uVar18) * -0x136640f27c8d3555 ^
               sVar14;
      data = (void *)((long)data + 0x20);
    } while (data < puVar16);
    seed = seed ^ ((uVar10 << 0x2f | uVar10 >> 0x11) + uVar9) * -0x34a50ac51c5553cf;
    uVar15 = (uint)len;
    len = sVar14 ^ ((uVar9 << 0x2f | uVar9 >> 0x11) + uVar10) * -0x3f9f8db57bdb0cbb;
    uVar9 = (ulong)(uVar15 & 0x1f);
  }
  switch(uVar9) {
  case 0:
    goto switchD_00143a09_caseD_0;
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    break;
  default:
    uVar10 = *data;
    data = (void *)((long)data + 8);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                   (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                   (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                   (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38;
    len = len + (SUB168(auVar8 * ZEXT816(0x9c06faf4d023e3ab),8) ^
                SUB168(auVar8 * ZEXT816(0x9c06faf4d023e3ab),0));
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
    uVar10 = *data;
    data = (void *)((long)data + 8);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                   (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                   (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                   (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38;
    seed = seed + (SUB168(auVar4 * ZEXT816(0xbd9cacc22c6e9571),8) ^
                  SUB168(auVar4 * ZEXT816(0xbd9cacc22c6e9571),0));
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
    uVar10 = *data;
    data = (void *)((long)data + 8);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                   (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
                   (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
                   (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38;
    len = len + (SUB168(auVar5 * ZEXT816(0xd4f06db99d67be4b),8) ^
                SUB168(auVar5 * ZEXT816(0xd4f06db99d67be4b),0));
  }
  switch((uint)uVar9 & 7) {
  case 0:
    uVar9 = *data;
    uVar9 = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 | (uVar9 & 0xff0000000000) >> 0x18 |
            (uVar9 & 0xff00000000) >> 8 | (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
            (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
    break;
  case 1:
    uVar9 = (ulong)(byte)*data;
    break;
  case 2:
    uVar9 = (ulong)(ushort)((ushort)*data << 8 | (ushort)*data >> 8);
    break;
  case 3:
    uVar10 = (ulong)(ushort)(*(ushort *)((long)data + 1) << 8 | *(ushort *)((long)data + 1) >> 8);
    uVar9 = (ulong)(byte)*data << 0x10;
    goto LAB_00143ad8;
  case 4:
    uVar15 = (uint)*data;
    uVar9 = (ulong)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                   uVar15 << 0x18);
    break;
  case 5:
    uVar15 = *(uint *)((long)data + 1);
    uVar10 = (ulong)(uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                    uVar15 << 0x18);
    uVar9 = (ulong)(byte)*data << 0x20;
    goto LAB_00143ad8;
  case 6:
    uVar15 = *(uint *)((long)data + 2);
    uVar10 = (ulong)CONCAT14(*(byte *)((long)data + 1),
                             uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                             uVar15 << 0x18);
    uVar9 = (ulong)(byte)*data << 0x28;
LAB_00143ad8:
    uVar9 = uVar9 | uVar10;
    break;
  case 7:
    uVar15 = *(uint *)((long)data + 3);
    uVar9 = (ulong)CONCAT16((byte)*data,
                            CONCAT15(*(byte *)((long)data + 1),
                                     CONCAT14(*(byte *)((long)data + 2),
                                              uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 |
                                              (uVar15 & 0xff00) << 8 | uVar15 << 0x18)));
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar9;
  seed = seed + (SUB168(auVar6 * ZEXT816(0x82434fe90edcef39),8) ^
                SUB168(auVar6 * ZEXT816(0x82434fe90edcef39),0));
switchD_00143a09_caseD_0:
  auVar7._8_8_ = 0;
  auVar7._0_8_ = seed + len << 0x2f | seed + len >> 0x11;
  uVar9 = (seed ^ len) * -0x136640f27c8d3555;
  return (SUB168(auVar7 * ZEXT816(0x9c06faf4d023e3ab),0) ^
         SUB168(auVar7 * ZEXT816(0x9c06faf4d023e3ab),8)) +
         (((seed ^ len) * -0x793e469aaa800000 | uVar9 >> 0x29) ^ uVar9);
}

Assistant:

uint64_t t1ha_64be(const void *data, size_t len, uint64_t seed) {
  uint64_t a = seed;
  uint64_t b = len;

  const int need_align = (((uintptr_t)data) & 7) != 0 && !UNALIGNED_OK;
  uint64_t align[4];

  if (unlikely(len > 32)) {
    uint64_t c = rot64(len, s1) + seed;
    uint64_t d = len ^ rot64(seed, s1);
    const void *detent = (const uint8_t *)data + len - 31;
    do {
      const uint64_t *v = (const uint64_t *)data;
      if (unlikely(need_align))
        v = (const uint64_t *)memcpy(&align, v, 32);

      uint64_t w0 = fetch64_be(v + 0);
      uint64_t w1 = fetch64_be(v + 1);
      uint64_t w2 = fetch64_be(v + 2);
      uint64_t w3 = fetch64_be(v + 3);

      uint64_t d02 = w0 ^ rot64(w2 + d, s1);
      uint64_t c13 = w1 ^ rot64(w3 + c, s1);
      c += a ^ rot64(w0, s0);
      d -= b ^ rot64(w1, s2);
      a ^= p1 * (d02 + w3);
      b ^= p0 * (c13 + w2);
      data = (const uint64_t *)data + 4;
    } while (likely(data < detent));

    a ^= p6 * (rot64(c, s1) + d);
    b ^= p5 * (c + rot64(d, s1));
    len &= 31;
  }

  const uint64_t *v = (const uint64_t *)data;
  if (unlikely(need_align) && len > 8)
    v = (const uint64_t *)memcpy(&align, v, len);

  switch (len) {
  default:
    b += mux64(fetch64_be(v++), p4);
  case 24:
  case 23:
  case 22:
  case 21:
  case 20:
  case 19:
  case 18:
  case 17:
    a += mux64(fetch64_be(v++), p3);
  case 16:
  case 15:
  case 14:
  case 13:
  case 12:
  case 11:
  case 10:
  case 9:
    b += mux64(fetch64_be(v++), p2);
  case 8:
  case 7:
  case 6:
  case 5:
  case 4:
  case 3:
  case 2:
  case 1:
    a += mux64(tail64_be(v, len), p1);
  case 0:
    return mux64(rot64(a + b, s1), p4) + mix(a ^ b, p0);
  }
}